

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall
Js::FunctionBody::TryGetDebuggerScopeAt(FunctionBody *this,int index,DebuggerScope **debuggerScope)

{
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00
  ;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ScopeObjectChain *pSVar4;
  undefined4 *puVar5;
  WriteBarrierPtr *this_01;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  **ppLVar6;
  DebuggerScope **ppDVar7;
  ScopeObjectChainList *scopeChain;
  DebuggerScope **debuggerScope_local;
  int index_local;
  FunctionBody *this_local;
  
  pSVar4 = GetScopeObjectChain(this);
  if (pSVar4 == (ScopeObjectChain *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1efd,"(this->GetScopeObjectChain())",
                                "TryGetDebuggerScopeAt should only be called with a valid scope chain in place."
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (index < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1efe,"(index >= 0)","index >= 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_01 = (WriteBarrierPtr *)GetScopeObjectChain(this);
  ppLVar6 = Memory::WriteBarrierPtr::operator_cast_to_List__(this_01);
  this_00 = *ppLVar6;
  iVar3 = JsUtil::ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>::Count
                    (&this_00->
                      super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>);
  if (index < iVar3) {
    ppDVar7 = JsUtil::
              List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_00,index);
    *debuggerScope = *ppDVar7;
  }
  return index < iVar3;
}

Assistant:

bool FunctionBody::TryGetDebuggerScopeAt(int index, DebuggerScope*& debuggerScope)
    {
        AssertMsg(this->GetScopeObjectChain(), "TryGetDebuggerScopeAt should only be called with a valid scope chain in place.");
        Assert(index >= 0);

        const Js::ScopeObjectChain::ScopeObjectChainList* scopeChain = this->GetScopeObjectChain()->pScopeChain;
        if (index < scopeChain->Count())
        {
            debuggerScope = scopeChain->Item(index);
            return true;
        }

        return false;
    }